

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DragInt(char *label,int *v,float v_speed,int v_min,int v_max,char *display_format)

{
  bool bVar1;
  float local_34;
  bool value_changed;
  char *pcStack_30;
  float v_f;
  char *display_format_local;
  int local_20;
  int v_max_local;
  int v_min_local;
  float v_speed_local;
  int *v_local;
  char *label_local;
  
  pcStack_30 = display_format;
  if (display_format == (char *)0x0) {
    pcStack_30 = "%.0f";
  }
  local_34 = (float)*v;
  display_format_local._4_4_ = v_max;
  local_20 = v_min;
  v_max_local = (int)v_speed;
  _v_min_local = v;
  v_local = (int *)label;
  bVar1 = DragFloat(label,&local_34,v_speed,(float)v_min,(float)v_max,pcStack_30,1.0);
  *_v_min_local = (int)local_34;
  return bVar1;
}

Assistant:

bool ImGui::DragInt(const char* label, int* v, float v_speed, int v_min, int v_max, const char* display_format)
{
    if (!display_format)
        display_format = "%.0f";
    float v_f = (float)*v;
    bool value_changed = DragFloat(label, &v_f, v_speed, (float)v_min, (float)v_max, display_format);
    *v = (int)v_f;
    return value_changed;
}